

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O2

int32 model_def_write(model_def_t *mdef,char *fn)

{
  acmod_set_t *paVar1;
  uint32 uVar2;
  uint32 uVar3;
  int32 iVar4;
  FILE *__stream;
  char *pcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  word_posn_t wp;
  acmod_id_t r;
  acmod_id_t l;
  acmod_id_t b;
  acmod_set_t *local_38;
  
  __stream = fopen(fn,"w");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                   ,0x124,"Unable to open %s for writing",fn);
    iVar4 = -1;
  }
  else {
    paVar1 = mdef->acmod_set;
    fprintf(__stream,"%s\n","0.3");
    uVar2 = acmod_set_n_ci(paVar1);
    fprintf(__stream,"%u n_base\n",(ulong)uVar2);
    uVar3 = acmod_set_n_multi(paVar1);
    fprintf(__stream,"%u n_tri\n",(ulong)uVar3);
    fprintf(__stream,"%u n_state_map\n",(ulong)mdef->n_total_state);
    fprintf(__stream,"%u n_tied_state\n",(ulong)mdef->n_tied_state);
    fprintf(__stream,"%u n_tied_ci_state\n",(ulong)mdef->n_tied_ci_state);
    fprintf(__stream,"%u n_tied_tmat\n",(ulong)mdef->n_tied_tmat);
    fwrite("#\n# Columns definitions\n",0x18,1,__stream);
    fprintf(__stream,"#%4s %3s %3s %1s %6s %4s %s\n","base","lft","rt","p","attrib","tmat",
            "     ... state id\'s ...");
    local_38 = paVar1;
    uVar3 = acmod_set_n_acmod(paVar1);
    uVar10 = (ulong)uVar2;
    for (uVar9 = 0; paVar1 = local_38, uVar9 != uVar10; uVar9 = uVar9 + 1) {
      pcVar5 = acmod_set_id2name(local_38,(acmod_id_t)uVar9);
      fprintf(__stream,"%5s %3s %3s %1s",pcVar5,"-","-","-");
      ppcVar6 = acmod_set_attrib(paVar1,(acmod_id_t)uVar9);
      if ((ppcVar6 == (char **)0x0) || (*ppcVar6 == (char *)0x0)) {
        fprintf(__stream," %6s","n/a");
      }
      else {
        fprintf(__stream," %6s");
        uVar11 = 1;
        while( true ) {
          if (ppcVar6[uVar11] == (char *)0x0) break;
          fprintf(__stream,",%s");
          uVar11 = (ulong)((int)uVar11 + 1);
        }
      }
      fprintf(__stream," %4d",(ulong)mdef->defn[uVar9].tmat);
      uVar11 = 0;
      while( true ) {
        if (mdef->defn[uVar9].n_state <= uVar11) break;
        if (mdef->defn[uVar9].state[uVar11] == 0xffffffff) {
          fwrite(" N",2,1,__stream);
        }
        else {
          fprintf(__stream," %6u");
        }
        uVar11 = uVar11 + 1;
      }
      fputc(10,__stream);
    }
    for (; paVar1 = local_38, uVar10 < uVar3; uVar10 = uVar10 + 1) {
      acmod_set_id2tri(local_38,&b,&l,&r,&wp,(acmod_id_t)uVar10);
      pcVar5 = acmod_set_id2name(paVar1,b);
      pcVar7 = acmod_set_id2name(paVar1,l);
      pcVar8 = acmod_set_id2name(paVar1,r);
      fprintf(__stream,"%5s %3s %3s %c",pcVar5,pcVar7,pcVar8,(ulong)(uint)(int)"besiu"[wp]);
      ppcVar6 = acmod_set_attrib(paVar1,(acmod_id_t)uVar10);
      if ((ppcVar6 == (char **)0x0) || (*ppcVar6 == (char *)0x0)) {
        fprintf(__stream," %6s","n/a");
      }
      else {
        fprintf(__stream," %6s");
        uVar9 = 1;
        while( true ) {
          if (ppcVar6[uVar9] == (char *)0x0) break;
          fprintf(__stream,",%s");
          uVar9 = (ulong)((int)uVar9 + 1);
        }
      }
      fprintf(__stream," %4d",(ulong)mdef->defn[uVar10].tmat);
      uVar9 = 0;
      while( true ) {
        if (mdef->defn[uVar10].n_state <= uVar9) break;
        if (mdef->defn[uVar10].state[uVar9] == 0xffffffff) {
          fwrite(" N",2,1,__stream);
        }
        else {
          fprintf(__stream," %6u");
        }
        uVar9 = uVar9 + 1;
      }
      fputc(10,__stream);
    }
    fclose(__stream);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int32
model_def_write(model_def_t *mdef,
		const char *fn)
{
    FILE *fp;
    uint32 n_ci;
    uint32 n_acmod;
    acmod_set_t *acmod_set;
    const char **attrib;
    acmod_id_t b;
    acmod_id_t l;
    acmod_id_t r;
    word_posn_t wp;
    uint32 p;
    char *wp2c = WORD_POSN_CHAR_MAP;
    uint32 i;

    fp = fopen(fn, "w");
    if (fp == NULL) {
	E_ERROR_SYSTEM("Unable to open %s for writing", fn);
	return S3_ERROR;
    }

    acmod_set = mdef->acmod_set;

    fprintf(fp, "%s\n", MODEL_DEF_VERSION);
    n_ci = acmod_set_n_ci(acmod_set);
    fprintf(fp, "%u n_base\n", n_ci);
    fprintf(fp, "%u n_tri\n", acmod_set_n_multi(acmod_set));
    fprintf(fp, "%u n_state_map\n", mdef->n_total_state);
    fprintf(fp, "%u n_tied_state\n", mdef->n_tied_state);
    fprintf(fp, "%u n_tied_ci_state\n", mdef->n_tied_ci_state);
    fprintf(fp, "%u n_tied_tmat\n", mdef->n_tied_tmat);
    fprintf(fp, "#\n# Columns definitions\n");
    fprintf(fp, "#%4s %3s %3s %1s %6s %4s %s\n",
	    "base", "lft", "rt", "p", "attrib", "tmat",
	    "     ... state id's ...");

    n_acmod = acmod_set_n_acmod(acmod_set);
    for (p = 0; p < n_ci; p++) {
	fprintf(fp, "%5s %3s %3s %1s",
		acmod_set_id2name(acmod_set, p),
		"-", "-", "-");

	attrib = acmod_set_attrib(acmod_set, p);
	if ((attrib == NULL) || (attrib[0] == NULL)) {
	    fprintf(fp, " %6s", "n/a");
	}
	else {
	    fprintf(fp, " %6s", attrib[0]);

	    for (i = 1; attrib[i]; i++) {
		fprintf(fp, ",%s", attrib[i]);
	    }
	}
	fprintf(fp, " %4d", mdef->defn[p].tmat);

	for (i = 0; i < mdef->defn[p].n_state; i++) {
	    if (mdef->defn[p].state[i] == NO_ID) {
		fprintf(fp, " N");
	    }
	    else {
		fprintf(fp, " %6u", mdef->defn[p].state[i]);
	    }
	}
	fprintf(fp, "\n");
    }

    for (; p < n_acmod; p++) {
	acmod_set_id2tri(acmod_set,
			 &b, &l, &r, &wp,
			 p);
	
	fprintf(fp, "%5s %3s %3s %c",
		acmod_set_id2name(acmod_set, b),
		acmod_set_id2name(acmod_set, l),
		acmod_set_id2name(acmod_set, r),
		wp2c[(uint32)wp]);

	attrib = acmod_set_attrib(acmod_set, p);
	if ((attrib == NULL) || (attrib[0] == NULL)) {
	    fprintf(fp, " %6s", "n/a");
	}
	else {
	    fprintf(fp, " %6s", attrib[0]);

	    for (i = 1; attrib[i]; i++) {
		fprintf(fp, ",%s", attrib[i]);
	    }
	}
	fprintf(fp, " %4d", mdef->defn[p].tmat);

	for (i = 0; i < mdef->defn[p].n_state; i++) {
	    if (mdef->defn[p].state[i] == NO_ID) {
		fprintf(fp, " N");
	    }
	    else {
		fprintf(fp, " %6u", mdef->defn[p].state[i]);
	    }
	}
	fprintf(fp, "\n");
    }

    fclose(fp);

    return S3_SUCCESS;
}